

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint8_t *puVar1;
  uint uVar2;
  uint8_t *ptr_1;
  uint8_t *puVar3;
  uint8_t *puVar4;
  
  if ((this->had_error_ == true) || (uVar2 = Flush(this,ptr), this->had_error_ == true)) {
    puVar4 = this->buffer_;
  }
  else {
    puVar1 = this->buffer_end_;
    puVar3 = (uint8_t *)0x0;
    puVar4 = puVar1 + ((ulong)uVar2 - 0x10);
    if ((int)uVar2 < 0x11) {
      puVar3 = puVar1;
      puVar4 = this->buffer_ + (int)uVar2;
    }
    this->end_ = puVar4;
    this->buffer_end_ = puVar3;
    puVar4 = this->buffer_;
    if (0x10 < (int)uVar2) {
      puVar4 = puVar1;
    }
  }
  return puVar4;
}

Assistant:

uint8_t* EpsCopyOutputStream::FlushAndResetBuffer(uint8_t* ptr) {
  if (had_error_) return buffer_;
  int s = Flush(ptr);
  if (had_error_) return buffer_;
  return SetInitialBuffer(buffer_end_, s);
}